

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coloredpointcloud.cc
# Opt level: O0

void __thiscall
gvr::ColoredPointCloud::resizeVertexList
          (ColoredPointCloud *this,int vn,bool with_scanprop,bool with_scanpos)

{
  _func_int **pp_Var1;
  int *piVar2;
  byte in_CL;
  byte in_DL;
  int in_ESI;
  PointCloud *in_RDI;
  ulong uVar3;
  bool in_stack_0000000a;
  bool in_stack_0000000b;
  int in_stack_0000000c;
  PointCloud *in_stack_00000010;
  int i_1;
  int i;
  uchar *p;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  _func_int **local_18;
  byte local_e;
  byte local_d;
  int local_c [3];
  
  local_d = in_DL & 1;
  local_e = in_CL & 1;
  uVar3 = (ulong)(in_ESI * 3);
  if ((long)uVar3 < 0) {
    uVar3 = 0xffffffffffffffff;
  }
  local_c[0] = in_ESI;
  local_18 = (_func_int **)operator_new__(uVar3);
  local_20 = PointCloud::getVertexCount(in_RDI);
  piVar2 = std::min<int>(&local_20,local_c);
  local_1c = *piVar2 * 3;
  while (local_1c = local_1c + -1, -1 < local_1c) {
    *(undefined1 *)((long)local_18 + (long)local_1c) =
         *(undefined1 *)((long)in_RDI[1].super_Model._vptr_Model + (long)local_1c);
  }
  local_28 = PointCloud::getVertexCount(in_RDI);
  piVar2 = std::min<int>(&local_28,local_c);
  for (local_24 = *piVar2 * 3; SBORROW4(local_24,local_c[0] * 3) != local_24 + local_c[0] * -3 < 0;
      local_24 = local_24 + 1) {
    *(undefined1 *)((long)local_18 + (long)local_24) = 0;
  }
  pp_Var1 = in_RDI[1].super_Model._vptr_Model;
  if (pp_Var1 != (_func_int **)0x0) {
    operator_delete__(pp_Var1);
  }
  in_RDI[1].super_Model._vptr_Model = local_18;
  PointCloud::resizeVertexList
            (in_stack_00000010,in_stack_0000000c,in_stack_0000000b,in_stack_0000000a);
  return;
}

Assistant:

void ColoredPointCloud::resizeVertexList(int vn, bool with_scanprop, bool with_scanpos)
{
  unsigned char *p=new unsigned char [3*vn];

  for (int i=3*std::min(getVertexCount(), vn)-1; i>=0; i--)
  {
    p[i]=rgb[i];
  }

  for (int i=3*std::min(getVertexCount(), vn); i<3*vn; i++)
  {
    p[i]=0;
  }

  delete [] rgb;

  rgb=p;

  PointCloud::resizeVertexList(vn, with_scanprop, with_scanpos);
}